

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::DeepScanLineInputFile::rawPixelData
          (DeepScanLineInputFile *this,int firstScanLine,char *pixelData,uint64_t *pixelDataSize)

{
  exr_result_t eVar1;
  exr_context_t ctxt;
  ostream *poVar2;
  char *pcVar3;
  undefined8 uVar4;
  stringstream *text;
  ulong *in_RCX;
  undefined4 *in_RDX;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  DeepChunkHeader *dch;
  uint64_t cbytes;
  exr_chunk_info_t cinfo;
  stringstream *in_stack_fffffffffffffc08;
  ArgExc *in_stack_fffffffffffffc10;
  void *in_stack_fffffffffffffc38;
  void *in_stack_fffffffffffffc40;
  exr_chunk_info_t *in_stack_fffffffffffffc48;
  undefined8 in_stack_fffffffffffffc50;
  int part_index;
  stringstream local_390 [16];
  ostream local_380 [8];
  exr_chunk_info_t *in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  exr_const_context_t in_stack_fffffffffffffc98;
  stringstream local_1f8 [16];
  ostream local_1e8 [376];
  undefined4 *local_70;
  ulong local_68;
  undefined4 local_58;
  long local_40;
  undefined8 local_38;
  long local_28;
  ulong *local_20;
  undefined4 *local_18;
  
  part_index = (int)((ulong)in_stack_fffffffffffffc50 >> 0x20);
  local_20 = in_RCX;
  local_18 = in_RDX;
  Context::operator_cast_to__priv_exr_context_t_((Context *)0x1668f8);
  std::
  __shared_ptr_access<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16690b);
  eVar1 = exr_read_scanline_chunk_info
                    (in_stack_fffffffffffffc98,in_stack_fffffffffffffc94,in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffc88);
  if (eVar1 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_390);
    poVar2 = std::operator<<(local_380,"Error reading deep pixel data from image file \"");
    pcVar3 = fileName((DeepScanLineInputFile *)0x166bdd);
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2,"\". Unable to query data block information.");
    text = (stringstream *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc((ArgExc *)poVar2,text);
    __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  local_68 = local_40 + local_28 + 0x1c;
  if ((local_18 == (undefined4 *)0x0) || (*local_20 < local_68)) {
    *local_20 = local_68;
  }
  else {
    *local_20 = local_68;
    local_70 = local_18;
    *local_18 = local_58;
    *(long *)(local_18 + 1) = local_28;
    *(long *)(local_18 + 3) = local_40;
    *(undefined8 *)(local_18 + 5) = local_38;
    local_18 = local_18 + 7;
    ctxt = Context::operator_cast_to__priv_exr_context_t_((Context *)0x166a35);
    std::
    __shared_ptr_access<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<Imf_3_3::DeepScanLineInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x166a48);
    eVar1 = exr_read_deep_chunk(ctxt,part_index,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                                in_stack_fffffffffffffc38);
    if (eVar1 != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1f8);
      poVar2 = std::operator<<(local_1e8,"Error reading deep pixel data from image file \"");
      pcVar3 = fileName((DeepScanLineInputFile *)0x166aba);
      poVar2 = std::operator<<(poVar2,pcVar3);
      poVar2 = std::operator<<(poVar2,"\". Unable to read raw pixel data of ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*local_20);
      std::operator<<(poVar2," bytes.");
      uVar4 = __cxa_allocate_exception(0x48);
      Iex_3_3::ArgExc::ArgExc(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      __cxa_throw(uVar4,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
    }
  }
  return;
}

Assistant:

void
DeepScanLineInputFile::rawPixelData (
    int firstScanLine, char* pixelData, uint64_t& pixelDataSize)
{
    exr_chunk_info_t cinfo;

    static_assert (sizeof(DeepChunkHeader) == 28, "Expect a 28-byte chunk header");

    // api is kind of different than the normal scanline raw pixel data
    // in that it also includes the chunk header block, so the full chunk

    if (EXR_ERR_SUCCESS == exr_read_scanline_chunk_info (
            _ctxt, _data->partNumber, firstScanLine, &cinfo))
    {
        uint64_t cbytes;
        cbytes = sizeof (DeepChunkHeader);
        cbytes += cinfo.sample_count_table_size;
        cbytes += cinfo.packed_size;

        if (!pixelData || cbytes > pixelDataSize)
        {
            pixelDataSize = cbytes;
            return;
        }

        pixelDataSize = cbytes;

        DeepChunkHeader* dch = reinterpret_cast<DeepChunkHeader*> (pixelData);
        dch->scanline = cinfo.start_y;
        dch->packedCountSize = cinfo.sample_count_table_size;
        dch->packedDataSize = cinfo.packed_size;
        dch->unpackedDataSize = cinfo.unpacked_size;

        pixelData += sizeof(DeepChunkHeader);
        if (EXR_ERR_SUCCESS !=
            exr_read_deep_chunk (
                _ctxt,
                _data->partNumber,
                &cinfo,
                pixelData + cinfo.sample_count_table_size,
                pixelData))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Error reading deep pixel data from image "
                "file \""
                << fileName () << "\". Unable to read raw pixel data of "
                << pixelDataSize << " bytes.");
        }
    }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Error reading deep pixel data from image "
            "file \""
            << fileName ()
            << "\". Unable to query data block information.");
    }
}